

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_func.c
# Opt level: O1

GCfunc * lj_func_newC(lua_State *L,MSize nelems,GCtab *env)

{
  GCfunc *pGVar1;
  
  pGVar1 = (GCfunc *)lj_mem_newgco(L,(ulong)nelems * 8 + 0x30);
  *(uint8_t *)((long)pGVar1 + 9) = '\b';
  *(uint8_t *)((long)pGVar1 + 10) = '\x01';
  (pGVar1->c).nupvalues = (uint8_t)nelems;
  (pGVar1->c).pc.ptr64 = (L->glref).ptr64 + 0x16c;
  (pGVar1->c).env.gcptr64 = (uint64_t)env;
  return pGVar1;
}

Assistant:

GCfunc *lj_func_newC(lua_State *L, MSize nelems, GCtab *env)
{
  GCfunc *fn = (GCfunc *)lj_mem_newgco(L, sizeCfunc(nelems));
  fn->c.gct = ~LJ_TFUNC;
  fn->c.ffid = FF_C;
  fn->c.nupvalues = (uint8_t)nelems;
  /* NOBARRIER: The GCfunc is new (marked white). */
  setmref(fn->c.pc, &G(L)->bc_cfunc_ext);
  setgcref(fn->c.env, obj2gco(env));
  return fn;
}